

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O1

size_type __thiscall baryonyx::itm::shared_subvector::emplace(shared_subvector *this)

{
  iterator __position;
  ulong in_RAX;
  uint i;
  undefined8 uStack_18;
  
  i = this->m_free_list_head;
  if ((ulong)i == 0xffffffff) {
    __position._M_current =
         (this->m_container).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    i = (int)__position._M_current -
        *(int *)&(this->m_container).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    uStack_18 = in_RAX & 0xffffffffffffff;
    std::vector<signed_char,_std::allocator<signed_char>_>::_M_fill_insert
              (&this->m_container,__position,(ulong)this->m_element_size,
               (value_type_conflict *)((long)&uStack_18 + 7));
  }
  else {
    this->m_free_list_head =
         *(size_type *)
          ((this->m_container).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
           .super__Vector_impl_data._M_start + i);
    uStack_18 = in_RAX;
  }
  check_index(this,i);
  return i;
}

Assistant:

[[nodiscard]] size_type emplace()
    {
        size_type new_position = 0;

        if (m_free_list_head != npos) {
            new_position = m_free_list_head;

            m_free_list_head =
              *(reinterpret_cast<size_type*>(&m_container[new_position]));

        } else {
            new_position = static_cast<size_type>(m_container.size());
            m_container.insert(std::end(m_container), m_element_size, 0);
        }

        check_index(new_position);

        return new_position;
    }